

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.h
# Opt level: O1

cmArgumentParser<void> * __thiscall
cmArgumentParser<void>::BindParsedKeywords
          (cmArgumentParser<void> *this,
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          *ref)

{
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  local_38._8_8_ = 0;
  pcStack_20 = std::
               _Function_handler<void_(ArgumentParser::Instance_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:426:7)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(ArgumentParser::Instance_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:426:7)>
             ::_M_manager;
  local_38._M_unused._M_object = ref;
  ArgumentParser::Base::BindParsedKeyword(&this->super_Base,(KeywordNameAction *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return this;
}

Assistant:

cmArgumentParser& BindParsedKeywords(std::vector<cm::string_view>& ref)
  {
    this->Base::BindParsedKeyword(
      [&ref](Instance&, cm::string_view arg) { ref.emplace_back(arg); });
    return *this;
  }